

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

RTPTransmissionInfo * __thiscall
jrtplib::RTPTCPTransmitter::GetTransmissionInfo(RTPTCPTransmitter *this)

{
  RTPMemoryManager *mgr;
  RTPTransmissionInfo *tinf;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local = (RTPTCPTransmitter *)0x0;
  }
  else {
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    this_local = (RTPTCPTransmitter *)operator_new(0x10,mgr,0x1c);
    RTPTCPTransmissionInfo::RTPTCPTransmissionInfo((RTPTCPTransmissionInfo *)this_local);
  }
  return (RTPTransmissionInfo *)this_local;
}

Assistant:

RTPTransmissionInfo *RTPTCPTransmitter::GetTransmissionInfo()
{
	if (!m_init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPTCPTransmissionInfo();
	MAINMUTEX_UNLOCK
	return tinf;
}